

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O3

int Mpm_CutCheckDsd6(Mpm_Man_t *p,word t)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong local_18;
  
  local_18 = -(ulong)((uint)t & 1) ^ t;
  puVar3 = (uint *)Hsh_IntManLookup(p->pHash,(uint *)&local_18);
  uVar2 = *puVar3;
  if ((ulong)uVar2 == 0xffffffff) {
    uVar2 = 0xffffffff;
  }
  else {
    if (((int)uVar2 < 0) || (p->vConfgRes->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar1 = p->vConfgRes->pArray[uVar2];
    uVar2 = uVar1 ^ 0x10000;
    if ((t & 1) == 0) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

int Mpm_CutCheckDsd6( Mpm_Man_t * p, word t )
{
    int fCompl, Entry, Config;
    if ( (fCompl = (t & 1)) )
        t = ~t;
    Entry = *Hsh_IntManLookup( p->pHash, (unsigned *)&t );
    if ( Entry == -1 )
        return -1;
    Config = Vec_IntEntry( p->vConfgRes, Entry );
    if ( fCompl )
        Config ^= (1 << 16);
    return Config;
}